

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairCompletePdu.cpp
# Opt level: O2

bool __thiscall DIS::RepairCompletePdu::operator==(RepairCompletePdu *this,RepairCompletePdu *rhs)

{
  undefined2 uVar1;
  undefined2 uVar3;
  ulong uVar2;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined4 in_ECX;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  bVar5 = LogisticsFamilyPdu::operator==
                    (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar6 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  bVar7 = EntityID::operator==(&this->_repairingEntityID,&rhs->_repairingEntityID);
  uVar2._0_2_ = this->_repair;
  uVar2._2_2_ = this->_padding2;
  uVar2._4_4_ = *(undefined4 *)&this->field_0x3c;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  uVar1 = rhs->_repair;
  uVar3 = rhs->_padding2;
  uVar4 = *(undefined4 *)&rhs->field_0x3c;
  auVar11._0_2_ = -(ushort)(uVar1 == (undefined2)uVar2);
  auVar11._2_2_ = -(ushort)(uVar3 == uVar2._2_2_);
  auVar11._4_2_ = -(ushort)((short)uVar4 == (short)uVar2._4_4_);
  auVar11._6_2_ = -(ushort)((short)((uint)uVar4 >> 0x10) == (short)((uint)uVar2._4_4_ >> 0x10));
  auVar11._8_2_ = 0xffff;
  auVar11._10_2_ = 0xffff;
  auVar11._12_2_ = 0xffff;
  auVar11._14_2_ = 0xffff;
  auVar9 = pshuflw(auVar9,auVar11,0x50);
  auVar10._0_4_ = auVar9._0_4_;
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar9._4_4_;
  auVar10._12_4_ = auVar9._4_4_;
  uVar8 = movmskpd(in_ECX,auVar10);
  return (bool)((bVar7 && (bVar6 && bVar5)) & (byte)uVar8 & (byte)uVar8 >> 1);
}

Assistant:

bool RepairCompletePdu::operator ==(const RepairCompletePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_repairingEntityID == rhs._repairingEntityID) ) ivarsEqual = false;
     if( ! (_repair == rhs._repair) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

    return ivarsEqual;
 }